

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)

{
  bool bVar1;
  long lVar2;
  undefined2 local_32;
  SQObjectPtr *pSStack_30;
  unsigned_short tag;
  SQObjectPtr *o;
  SQUserPointer up_local;
  SQWRITEFUNC w_local;
  HSQUIRRELVM v_local;
  
  pSStack_30 = (SQObjectPtr *)0x0;
  o = (SQObjectPtr *)up;
  up_local = w;
  w_local = (SQWRITEFUNC)v;
  bVar1 = sq_aux_gettypedarg(v,-1,OT_CLOSURE,&stack0xffffffffffffffd0);
  if (bVar1) {
    local_32 = 0xfafa;
    if (((pSStack_30->super_SQObject)._unVal.pClosure)->_function->_noutervalues == 0) {
      lVar2 = (*(code *)up_local)(o,&local_32,2);
      if (lVar2 == 2) {
        bVar1 = SQClosure::Save((pSStack_30->super_SQObject)._unVal.pClosure,(SQVM *)w_local,o,
                                (SQWRITEFUNC)up_local);
        if (bVar1) {
          v_local = (HSQUIRRELVM)0x0;
        }
        else {
          v_local = (HSQUIRRELVM)0xffffffffffffffff;
        }
      }
      else {
        v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)w_local,"io error");
      }
    }
    else {
      v_local = (HSQUIRRELVM)
                sq_throwerror((HSQUIRRELVM)w_local,
                              "a closure with free variables bound cannot be serialized");
    }
  }
  else {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, -1, OT_CLOSURE,o);
    unsigned short tag = SQ_BYTECODE_STREAM_TAG;
    if(_closure(*o)->_function->_noutervalues)
        return sq_throwerror(v,_SC("a closure with free variables bound cannot be serialized"));
    if(w(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(!_closure(*o)->Save(v,up,w))
        return SQ_ERROR;
    return SQ_OK;
}